

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O3

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::computeExpectedFTSensorsMeasurements
          (ExtWrenchesAndJointTorquesEstimator *this,LinkUnknownWrenchContacts *unknowns,
          SensorsMeasurements *predictedMeasures,LinkContactWrenches *estimatedContactWrenches,
          JointDOFsDoubleArray *estimatedJointTorques)

{
  Traversal *traversal;
  LinkVelArray *linkVel;
  LinkAccArray *linkProperAcc;
  bool bVar1;
  char cVar2;
  VectorDynSize *pVVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (this->m_isModelValid == false) {
    pcVar5 = "computeExpectedFTSensorsMeasurements";
    pcVar4 = "Model and sensors information not set.";
  }
  else if (this->m_isKinematicsUpdated == false) {
    pcVar5 = "computeExpectedFTSensorsMeasurements";
    pcVar4 = "Kinematic information not set.";
  }
  else {
    traversal = &this->m_dynamicTraversal;
    linkVel = &this->m_linkVels;
    linkProperAcc = &this->m_linkProperAccs;
    bVar1 = estimateExternalWrenchesWithoutInternalFT
                      (&this->m_model,traversal,unknowns,&this->m_jointPos,linkVel,linkProperAcc,
                       &this->m_calibBufs,estimatedContactWrenches);
    if (bVar1) {
      cVar2 = iDynTree::LinkContactWrenches::computeNetWrenches
                        ((LinkWrenches *)estimatedContactWrenches);
      if (cVar2 == '\0') {
        pcVar5 = "estimateExtWrenchesAndJointTorques";
        pcVar4 = "Error in computing the net external wrenches from the estimated contact forces";
      }
      else {
        cVar2 = iDynTree::RNEADynamicPhase
                          (&this->m_model,traversal,&this->m_jointPos,linkVel,linkProperAcc,
                           &this->m_linkNetExternalWrenches,&this->m_linkIntWrenches,
                           &this->m_generalizedTorques);
        if (cVar2 != '\0') {
          iDynTree::predictSensorsMeasurementsFromRawBuffers
                    (&this->m_model,traversal,linkVel,linkProperAcc,&this->m_linkIntWrenches,
                     predictedMeasures);
          pVVar3 = (VectorDynSize *)iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
          iDynTree::VectorDynSize::operator=((VectorDynSize *)estimatedJointTorques,pVVar3);
          return true;
        }
        pcVar5 = "estimateExtWrenchesAndJointTorques";
        pcVar4 = "Error in computing the dynamic phase of the RNEA.";
      }
    }
    else {
      pcVar5 = "estimateExtWrenchesAndJointTorques";
      pcVar4 = 
      "Error in estimating the external contact wrenches without using the internal FT sensors.";
    }
  }
  iDynTree::reportError("ExtWrenchesAndJointTorquesEstimator",pcVar5,pcVar4);
  return false;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::computeExpectedFTSensorsMeasurements(const LinkUnknownWrenchContacts& unknowns,
                                                                                     SensorsMeasurements& predictedMeasures,
                                                                                     LinkContactWrenches& estimatedContactWrenches,
                                                                                     JointDOFsDoubleArray& estimatedJointTorques)
{
    if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","computeExpectedFTSensorsMeasurements",
                    "Model and sensors information not set.");
        return false;
    }

    if( !m_isKinematicsUpdated )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","computeExpectedFTSensorsMeasurements",
                    "Kinematic information not set.");
        return false;
    }

    /**
     * Compute external wrenches
     */
    bool ok = estimateExternalWrenchesWithoutInternalFT(m_model,m_dynamicTraversal,unknowns,
                                                        m_jointPos,m_linkVels,m_linkProperAccs,
                                                        m_calibBufs,estimatedContactWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in estimating the external contact wrenches without using the internal FT sensors.");
        return false;
    }

    /**
     * Compute net external wrenches
     */
    ok = ok && estimatedContactWrenches.computeNetWrenches(m_linkNetExternalWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the net external wrenches from the estimated contact forces");
        return false;
    }

    /**
     * Compute joint torques
     */
    ok = ok && RNEADynamicPhase(m_model,m_dynamicTraversal,m_jointPos,m_linkVels,m_linkProperAccs,
                                m_linkNetExternalWrenches,m_linkIntWrenches,m_generalizedTorques);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the dynamic phase of the RNEA.");
        return false;
    }

    /**
     * Simulate FT sensor measurements
     */
    predictSensorsMeasurementsFromRawBuffers(m_model,m_dynamicTraversal,
                                             m_linkVels,m_linkProperAccs,m_linkIntWrenches,predictedMeasures);


    /**
     * Copy the joint torques computed by the RNEA to the output
     */
    estimatedJointTorques = m_generalizedTorques.jointTorques();


    return ok;
}